

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTextureSwizzleTests.cpp
# Opt level: O0

void __thiscall
gl3cts::TextureSwizzle::IntialStateTest::verifyValues(IntialStateTest *this,GLenum texture_target)

{
  int iVar1;
  deUint32 dVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  TestError *pTVar4;
  int local_48;
  int local_44;
  GLint param [4];
  int local_30;
  int local_2c;
  GLint alpha;
  GLint blue;
  GLint green;
  GLint red;
  Functions *gl;
  IntialStateTest *pIStack_10;
  GLenum texture_target_local;
  IntialStateTest *this_local;
  
  gl._4_4_ = texture_target;
  pIStack_10 = this;
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  _green = CONCAT44(extraout_var,iVar1);
  blue = 0;
  alpha = 0;
  local_2c = 0;
  local_30 = 0;
  memset(&local_48,0,0x10);
  (**(code **)(_green + 0xab8))(gl._4_4_,0x8e42,&blue);
  dVar2 = (**(code **)(_green + 0x800))();
  glu::checkError(dVar2,"GetTexParameterIiv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                  ,0x935);
  (**(code **)(_green + 0xab8))(gl._4_4_,0x8e43,&alpha);
  dVar2 = (**(code **)(_green + 0x800))();
  glu::checkError(dVar2,"GetTexParameterIiv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                  ,0x937);
  (**(code **)(_green + 0xab8))(gl._4_4_,0x8e44,&local_2c);
  dVar2 = (**(code **)(_green + 0x800))();
  glu::checkError(dVar2,"GetTexParameterIiv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                  ,0x939);
  (**(code **)(_green + 0xab8))(gl._4_4_,0x8e45,&local_30);
  dVar2 = (**(code **)(_green + 0x800))();
  glu::checkError(dVar2,"GetTexParameterIiv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                  ,0x93b);
  (**(code **)(_green + 0xab8))(gl._4_4_,0x8e46,&local_48);
  dVar2 = (**(code **)(_green + 0x800))();
  glu::checkError(dVar2,"GetTexParameterIiv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                  ,0x93d);
  if (blue != 0x1903) {
    pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar4,"Got invalid initial state for TEXTURE_SWIZZLE_R",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
               ,0x941);
    __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  if (alpha != 0x1904) {
    pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar4,"Got invalid initial state for TEXTURE_SWIZZLE_G",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
               ,0x945);
    __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  if (local_2c != 0x1905) {
    pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar4,"Got invalid initial state for TEXTURE_SWIZZLE_B",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
               ,0x949);
    __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  if (local_30 != 0x1906) {
    pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar4,"Got invalid initial state for TEXTURE_SWIZZLE_A",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
               ,0x94d);
    __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  if (local_48 != 0x1903) {
    pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar4,"Got invalid initial red state for TEXTURE_SWIZZLE_RGBA",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
               ,0x952);
    __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  if (local_44 != 0x1904) {
    pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar4,"Got invalid initial green state for TEXTURE_SWIZZLE_RGBA",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
               ,0x956);
    __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  if (param[0] != 0x1905) {
    pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar4,"Got invalid initial blue state for TEXTURE_SWIZZLE_RGBA",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
               ,0x95a);
    __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  if (param[1] != 0x1906) {
    pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar4,"Got invalid initial alpha state for TEXTURE_SWIZZLE_RGBA",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
               ,0x95e);
    __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  return;
}

Assistant:

void IntialStateTest::verifyValues(const glw::GLenum texture_target)
{
	/*  */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	glw::GLint red		= 0;
	glw::GLint green	= 0;
	glw::GLint blue		= 0;
	glw::GLint alpha	= 0;
	glw::GLint param[4] = { 0 };

	gl.getTexParameterIiv(texture_target, GL_TEXTURE_SWIZZLE_R, &red);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetTexParameterIiv");
	gl.getTexParameterIiv(texture_target, GL_TEXTURE_SWIZZLE_G, &green);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetTexParameterIiv");
	gl.getTexParameterIiv(texture_target, GL_TEXTURE_SWIZZLE_B, &blue);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetTexParameterIiv");
	gl.getTexParameterIiv(texture_target, GL_TEXTURE_SWIZZLE_A, &alpha);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetTexParameterIiv");
	gl.getTexParameterIiv(texture_target, GL_TEXTURE_SWIZZLE_RGBA, param);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetTexParameterIiv");

	if (GL_RED != red)
	{
		TCU_FAIL("Got invalid initial state for TEXTURE_SWIZZLE_R");
	}
	if (GL_GREEN != green)
	{
		TCU_FAIL("Got invalid initial state for TEXTURE_SWIZZLE_G");
	}
	if (GL_BLUE != blue)
	{
		TCU_FAIL("Got invalid initial state for TEXTURE_SWIZZLE_B");
	}
	if (GL_ALPHA != alpha)
	{
		TCU_FAIL("Got invalid initial state for TEXTURE_SWIZZLE_A");
	}

	if (GL_RED != param[0])
	{
		TCU_FAIL("Got invalid initial red state for TEXTURE_SWIZZLE_RGBA");
	}
	if (GL_GREEN != param[1])
	{
		TCU_FAIL("Got invalid initial green state for TEXTURE_SWIZZLE_RGBA");
	}
	if (GL_BLUE != param[2])
	{
		TCU_FAIL("Got invalid initial blue state for TEXTURE_SWIZZLE_RGBA");
	}
	if (GL_ALPHA != param[3])
	{
		TCU_FAIL("Got invalid initial alpha state for TEXTURE_SWIZZLE_RGBA");
	}
}